

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.h
# Opt level: O0

void __thiscall flow::Handler::~Handler(Handler *this)

{
  Handler *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->code_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

~Handler() = default;